

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

bool embree::avx512::SphereMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *sphere)

{
  float fVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  Geometry *pGVar4;
  long lVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  bool bVar21;
  Scene *pSVar22;
  ulong uVar23;
  byte bVar24;
  byte bVar25;
  ushort uVar26;
  ulong uVar27;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar57 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [36];
  undefined1 extraout_var [36];
  undefined1 extraout_var_00 [36];
  float fVar45;
  float fVar46;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [36];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [36];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [28];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar64 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar65 [28];
  undefined1 auVar67 [64];
  undefined1 auVar68 [28];
  undefined1 auVar69 [32];
  undefined1 auVar71 [28];
  undefined1 auVar72 [64];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<8> hit;
  int local_288;
  ushort local_284;
  ushort local_282;
  RayQueryContext *local_280;
  Primitive *local_278;
  Scene *local_270;
  float local_264;
  undefined4 local_260;
  uint local_25c;
  undefined4 local_258;
  undefined8 local_254;
  undefined4 local_24c;
  uint local_248;
  uint local_244;
  uint local_240;
  RTCFilterFunctionNArguments local_230;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  float fVar28;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar63 [64];
  undefined1 auVar66 [32];
  undefined1 auVar70 [64];
  
  pSVar22 = context->scene;
  pGVar4 = (pSVar22->geometries).items[sphere->sharedGeomID].ptr;
  lVar5 = *(long *)&pGVar4->field_0x58;
  _Var6 = pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar42._16_16_ = *(undefined1 (*) [16])(lVar5 + (sphere->primIDs).field_0.i[4] * _Var6);
  auVar42._0_16_ = *(undefined1 (*) [16])(lVar5 + (sphere->primIDs).field_0.i[0] * _Var6);
  auVar30._16_16_ = *(undefined1 (*) [16])(lVar5 + (sphere->primIDs).field_0.i[5] * _Var6);
  auVar30._0_16_ = *(undefined1 (*) [16])(lVar5 + (sphere->primIDs).field_0.i[1] * _Var6);
  auVar31._16_16_ = *(undefined1 (*) [16])(lVar5 + (sphere->primIDs).field_0.i[6] * _Var6);
  auVar31._0_16_ = *(undefined1 (*) [16])(lVar5 + (sphere->primIDs).field_0.i[2] * _Var6);
  auVar55._16_16_ = *(undefined1 (*) [16])(lVar5 + (sphere->primIDs).field_0.i[7] * _Var6);
  auVar55._0_16_ = *(undefined1 (*) [16])(lVar5 + (sphere->primIDs).field_0.i[3] * _Var6);
  auVar33 = vunpcklps_avx(auVar42,auVar31);
  auVar62 = vunpckhps_avx(auVar42,auVar31);
  auVar42 = vunpcklps_avx(auVar30,auVar55);
  auVar57 = vunpckhps_avx(auVar30,auVar55);
  auVar35 = vunpcklps_avx(auVar33,auVar42);
  auVar33 = vunpckhps_avx(auVar33,auVar42);
  local_80[0] = vpbroadcastd_avx512vl();
  auVar8 = vpalignr_avx(*(undefined1 (*) [16])((long)&(ray->dir).field_0 + 8),
                        *(undefined1 (*) [16])((long)&(ray->org).field_0 + 8),8);
  auVar8 = vdpps_avx(auVar8,auVar8,0x7f);
  auVar34 = vunpcklps_avx(auVar62,auVar57);
  auVar42 = vunpckhps_avx(auVar62,auVar57);
  auVar30 = vpbroadcastd_avx512vl();
  auVar29._12_4_ = 0;
  auVar29._0_12_ = ZEXT812(0);
  auVar29 = vrcp14ss_avx512f(auVar29 << 0x20,ZEXT416(auVar8._0_4_));
  auVar8 = vfnmadd213ss_fma(auVar8,auVar29,ZEXT416(0x40000000));
  fVar28 = auVar29._0_4_ * auVar8._0_4_;
  fVar1 = (ray->dir).field_0.m128[0];
  auVar66._4_4_ = fVar1;
  auVar66._0_4_ = fVar1;
  auVar66._8_4_ = fVar1;
  auVar66._12_4_ = fVar1;
  auVar66._16_4_ = fVar1;
  auVar66._20_4_ = fVar1;
  auVar66._24_4_ = fVar1;
  auVar66._28_4_ = fVar1;
  auVar67 = ZEXT3264(auVar66);
  fVar45 = (float)*(undefined8 *)((long)&(ray->dir).field_0 + 4);
  auVar69._4_4_ = fVar45;
  auVar69._0_4_ = fVar45;
  auVar69._8_4_ = fVar45;
  auVar69._12_4_ = fVar45;
  auVar69._16_4_ = fVar45;
  auVar69._20_4_ = fVar45;
  auVar69._24_4_ = fVar45;
  auVar69._28_4_ = fVar45;
  auVar70 = ZEXT3264(auVar69);
  fVar46 = (float)*(undefined8 *)((long)&(ray->dir).field_0 + 8);
  auVar72 = ZEXT3264(CONCAT428(fVar46,CONCAT424(fVar46,CONCAT420(fVar46,CONCAT416(fVar46,CONCAT412(
                                                  fVar46,CONCAT48(fVar46,CONCAT44(fVar46,fVar46)))))
                                               )));
  uVar2 = *(undefined4 *)&(ray->org).field_0;
  auVar62._4_4_ = uVar2;
  auVar62._0_4_ = uVar2;
  auVar62._8_4_ = uVar2;
  auVar62._12_4_ = uVar2;
  auVar62._16_4_ = uVar2;
  auVar62._20_4_ = uVar2;
  auVar62._24_4_ = uVar2;
  auVar62._28_4_ = uVar2;
  auVar31 = vsubps_avx512vl(auVar35,auVar62);
  uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar57._4_4_ = uVar2;
  auVar57._0_4_ = uVar2;
  auVar57._8_4_ = uVar2;
  auVar57._12_4_ = uVar2;
  auVar57._16_4_ = uVar2;
  auVar57._20_4_ = uVar2;
  auVar57._24_4_ = uVar2;
  auVar57._28_4_ = uVar2;
  auVar32 = vsubps_avx512vl(auVar33,auVar57);
  uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar33._4_4_ = uVar2;
  auVar33._0_4_ = uVar2;
  auVar33._8_4_ = uVar2;
  auVar33._12_4_ = uVar2;
  auVar33._16_4_ = uVar2;
  auVar33._20_4_ = uVar2;
  auVar33._24_4_ = uVar2;
  auVar33._28_4_ = uVar2;
  auVar33 = vsubps_avx512vl(auVar34,auVar33);
  auVar47._0_4_ = fVar46 * auVar33._0_4_;
  auVar47._4_4_ = fVar46 * auVar33._4_4_;
  auVar47._8_4_ = fVar46 * auVar33._8_4_;
  auVar47._12_4_ = fVar46 * auVar33._12_4_;
  auVar47._16_4_ = fVar46 * auVar33._16_4_;
  auVar47._20_4_ = fVar46 * auVar33._20_4_;
  auVar47._24_4_ = fVar46 * auVar33._24_4_;
  auVar47._28_4_ = 0;
  auVar8 = vfmadd231ps_fma(auVar47,auVar32,auVar69);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar31,auVar66);
  auVar48._0_4_ = fVar28 * auVar8._0_4_;
  auVar48._4_4_ = fVar28 * auVar8._4_4_;
  auVar48._8_4_ = fVar28 * auVar8._8_4_;
  auVar48._12_4_ = fVar28 * auVar8._12_4_;
  auVar48._16_4_ = fVar28 * 0.0;
  auVar48._20_4_ = fVar28 * 0.0;
  auVar48._24_4_ = fVar28 * 0.0;
  auVar48._28_4_ = 0;
  auVar35._4_4_ = fVar1 * auVar48._4_4_;
  auVar35._0_4_ = fVar1 * auVar48._0_4_;
  auVar35._8_4_ = fVar1 * auVar48._8_4_;
  auVar35._12_4_ = fVar1 * auVar48._12_4_;
  auVar35._16_4_ = fVar1 * auVar48._16_4_;
  auVar35._20_4_ = fVar1 * auVar48._20_4_;
  auVar35._24_4_ = fVar1 * auVar48._24_4_;
  auVar35._28_4_ = auVar34._28_4_;
  auVar56._0_4_ = fVar45 * auVar48._0_4_;
  auVar56._4_4_ = fVar45 * auVar48._4_4_;
  auVar56._8_4_ = fVar45 * auVar48._8_4_;
  auVar56._12_4_ = fVar45 * auVar48._12_4_;
  auVar56._16_4_ = fVar45 * auVar48._16_4_;
  auVar56._20_4_ = fVar45 * auVar48._20_4_;
  auVar56._28_36_ = in_ZMM8._28_36_;
  auVar56._24_4_ = fVar45 * auVar48._24_4_;
  auVar60._0_4_ = fVar46 * auVar48._0_4_;
  auVar60._4_4_ = fVar46 * auVar48._4_4_;
  auVar60._8_4_ = fVar46 * auVar48._8_4_;
  auVar60._12_4_ = fVar46 * auVar48._12_4_;
  auVar60._16_4_ = fVar46 * auVar48._16_4_;
  auVar60._20_4_ = fVar46 * auVar48._20_4_;
  auVar60._28_36_ = in_ZMM9._28_36_;
  auVar60._24_4_ = fVar46 * auVar48._24_4_;
  auVar62 = vsubps_avx(auVar31,auVar35);
  auVar58 = ZEXT3264(auVar62);
  auVar57 = vsubps_avx(auVar32,auVar56._0_32_);
  auVar64 = ZEXT3264(auVar57);
  auVar33 = vsubps_avx(auVar33,auVar60._0_32_);
  auVar56 = ZEXT3264(auVar33);
  auVar34._4_4_ = auVar33._4_4_ * auVar33._4_4_;
  auVar34._0_4_ = auVar33._0_4_ * auVar33._0_4_;
  auVar34._8_4_ = auVar33._8_4_ * auVar33._8_4_;
  auVar34._12_4_ = auVar33._12_4_ * auVar33._12_4_;
  auVar34._16_4_ = auVar33._16_4_ * auVar33._16_4_;
  auVar34._20_4_ = auVar33._20_4_ * auVar33._20_4_;
  auVar34._24_4_ = auVar33._24_4_ * auVar33._24_4_;
  auVar34._28_4_ = auVar32._28_4_;
  auVar8 = vfmadd231ps_fma(auVar34,auVar57,auVar57);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar62,auVar62);
  auVar32._4_4_ = auVar42._4_4_ * auVar42._4_4_;
  auVar32._0_4_ = auVar42._0_4_ * auVar42._0_4_;
  auVar32._8_4_ = auVar42._8_4_ * auVar42._8_4_;
  auVar32._12_4_ = auVar42._12_4_ * auVar42._12_4_;
  auVar32._16_4_ = auVar42._16_4_ * auVar42._16_4_;
  auVar32._20_4_ = auVar42._20_4_ * auVar42._20_4_;
  auVar32._24_4_ = auVar42._24_4_ * auVar42._24_4_;
  auVar32._28_4_ = auVar31._28_4_;
  uVar9 = vcmpps_avx512vl(ZEXT1632(auVar8),auVar32,2);
  uVar10 = vpcmpgtd_avx512vl(auVar30,_DAT_01fb4ba0);
  bVar24 = (byte)uVar9 & (byte)uVar10;
  if (bVar24 != 0) {
    auVar42 = vsubps_avx(auVar32,ZEXT1632(auVar8));
    auVar16._4_4_ = fVar28 * auVar42._4_4_;
    auVar16._0_4_ = fVar28 * auVar42._0_4_;
    auVar16._8_4_ = fVar28 * auVar42._8_4_;
    auVar16._12_4_ = fVar28 * auVar42._12_4_;
    auVar16._16_4_ = fVar28 * auVar42._16_4_;
    auVar16._20_4_ = fVar28 * auVar42._20_4_;
    auVar16._24_4_ = fVar28 * auVar42._24_4_;
    auVar16._28_4_ = fVar28;
    auVar42 = vsqrtps_avx(auVar16);
    auVar60 = ZEXT3264(auVar42);
    auVar35 = vsubps_avx(auVar48,auVar42);
    uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar52._4_4_ = uVar2;
    auVar52._0_4_ = uVar2;
    auVar52._8_4_ = uVar2;
    auVar52._12_4_ = uVar2;
    auVar52._16_4_ = uVar2;
    auVar52._20_4_ = uVar2;
    auVar52._24_4_ = uVar2;
    auVar52._28_4_ = uVar2;
    auVar61._0_4_ = auVar48._0_4_ + auVar42._0_4_;
    auVar61._4_4_ = auVar48._4_4_ + auVar42._4_4_;
    auVar61._8_4_ = auVar48._8_4_ + auVar42._8_4_;
    auVar61._12_4_ = auVar48._12_4_ + auVar42._12_4_;
    auVar61._16_4_ = auVar48._16_4_ + auVar42._16_4_;
    auVar61._20_4_ = auVar48._20_4_ + auVar42._20_4_;
    auVar61._24_4_ = auVar48._24_4_ + auVar42._24_4_;
    auVar61._28_4_ = auVar42._28_4_ + 0.0;
    auVar63 = ZEXT3264(auVar61);
    auVar49._8_4_ = 4;
    auVar49._0_8_ = 0x400000004;
    auVar49._12_4_ = 4;
    auVar49._16_4_ = 4;
    auVar49._20_4_ = 4;
    auVar49._24_4_ = 4;
    auVar49._28_4_ = 4;
    auVar3._0_16_ = *(undefined1 (*) [16])&ray->dir;
    auVar3._16_4_ = ray->tfar;
    auVar3._20_4_ = ray->mask;
    auVar3._24_4_ = ray->id;
    auVar3._28_4_ = ray->flags;
    auVar34 = vpermps_avx2(auVar49,auVar3);
    uVar27 = vcmpps_avx512vl(auVar35,auVar34,2);
    uVar23 = vcmpps_avx512vl(auVar52,auVar35,2);
    uVar27 = uVar27 & uVar23;
    bVar11 = (byte)uVar27 & bVar24;
    uVar9 = vcmpps_avx512vl(auVar52,auVar61,2);
    uVar10 = vcmpps_avx512vl(auVar61,auVar34,2);
    bVar25 = (byte)uVar9 & (byte)uVar10;
    bVar12 = bVar25 & bVar24;
    uVar26 = (ushort)bVar12;
    if (bVar11 != 0 || bVar12 != 0) {
      auVar34 = vblendmps_avx512vl(auVar61,auVar35);
      local_1e0._0_4_ =
           (uint)(bVar11 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar35._0_4_;
      bVar21 = (bool)(bVar11 >> 1 & 1);
      local_1e0._4_4_ = (uint)bVar21 * auVar34._4_4_ | (uint)!bVar21 * auVar35._4_4_;
      bVar21 = (bool)(bVar11 >> 2 & 1);
      local_1e0._8_4_ = (uint)bVar21 * auVar34._8_4_ | (uint)!bVar21 * auVar35._8_4_;
      bVar21 = (bool)(bVar11 >> 3 & 1);
      local_1e0._12_4_ = (uint)bVar21 * auVar34._12_4_ | (uint)!bVar21 * auVar35._12_4_;
      bVar21 = (bool)(bVar11 >> 4 & 1);
      local_1e0._16_4_ = (uint)bVar21 * auVar34._16_4_ | (uint)!bVar21 * auVar35._16_4_;
      bVar21 = (bool)(bVar11 >> 5 & 1);
      local_1e0._20_4_ = (uint)bVar21 * auVar34._20_4_ | (uint)!bVar21 * auVar35._20_4_;
      bVar21 = (bool)(bVar11 >> 6 & 1);
      local_1e0._24_4_ = (uint)bVar21 * auVar34._24_4_ | (uint)!bVar21 * auVar35._24_4_;
      local_1e0._28_4_ =
           (uint)(bVar11 >> 7) * auVar34._28_4_ | (uint)!(bool)(bVar11 >> 7) * auVar35._28_4_;
      auVar43 = ZEXT3264(local_1e0);
      auVar14._8_4_ = 0x80000000;
      auVar14._0_8_ = 0x8000000080000000;
      auVar14._12_4_ = 0x80000000;
      auVar14._16_4_ = 0x80000000;
      auVar14._20_4_ = 0x80000000;
      auVar14._24_4_ = 0x80000000;
      auVar14._28_4_ = 0x80000000;
      auVar35 = vxorps_avx512vl(auVar42,auVar14);
      fVar28 = (float)((uint)(bVar11 & 1) * auVar35._0_4_ |
                      (uint)!(bool)(bVar11 & 1) * (int)auVar42._0_4_);
      bVar21 = (bool)(bVar11 >> 1 & 1);
      fVar36 = (float)((uint)bVar21 * auVar35._4_4_ | (uint)!bVar21 * (int)auVar42._4_4_);
      bVar21 = (bool)(bVar11 >> 2 & 1);
      fVar37 = (float)((uint)bVar21 * auVar35._8_4_ | (uint)!bVar21 * (int)auVar42._8_4_);
      bVar21 = (bool)(bVar11 >> 3 & 1);
      fVar38 = (float)((uint)bVar21 * auVar35._12_4_ | (uint)!bVar21 * (int)auVar42._12_4_);
      bVar21 = (bool)(bVar11 >> 4 & 1);
      fVar39 = (float)((uint)bVar21 * auVar35._16_4_ | (uint)!bVar21 * (int)auVar42._16_4_);
      bVar21 = (bool)(bVar11 >> 5 & 1);
      fVar40 = (float)((uint)bVar21 * auVar35._20_4_ | (uint)!bVar21 * (int)auVar42._20_4_);
      bVar21 = (bool)(bVar11 >> 6 & 1);
      fVar41 = (float)((uint)bVar21 * auVar35._24_4_ | (uint)!bVar21 * (int)auVar42._24_4_);
      auVar17._4_4_ = fVar1 * fVar36;
      auVar17._0_4_ = fVar1 * fVar28;
      auVar17._8_4_ = fVar1 * fVar37;
      auVar17._12_4_ = fVar1 * fVar38;
      auVar17._16_4_ = fVar1 * fVar39;
      auVar17._20_4_ = fVar1 * fVar40;
      auVar17._24_4_ = fVar1 * fVar41;
      auVar17._28_4_ = uVar2;
      auVar18._4_4_ = fVar45 * fVar36;
      auVar18._0_4_ = fVar45 * fVar28;
      auVar18._8_4_ = fVar45 * fVar37;
      auVar18._12_4_ = fVar45 * fVar38;
      auVar18._16_4_ = fVar45 * fVar39;
      auVar18._20_4_ = fVar45 * fVar40;
      auVar18._24_4_ = fVar45 * fVar41;
      auVar18._28_4_ = auVar31._28_4_;
      auVar19._4_4_ = fVar46 * fVar36;
      auVar19._0_4_ = fVar46 * fVar28;
      auVar19._8_4_ = fVar46 * fVar37;
      auVar19._12_4_ = fVar46 * fVar38;
      auVar19._16_4_ = fVar46 * fVar39;
      auVar19._20_4_ = fVar46 * fVar40;
      auVar19._24_4_ = fVar46 * fVar41;
      auVar19._28_4_ =
           (uint)(bVar11 >> 7) * auVar35._28_4_ | (uint)!(bool)(bVar11 >> 7) * (int)auVar42._28_4_;
      local_1c0 = vsubps_avx(auVar17,auVar62);
      auVar53 = ZEXT3264(local_1c0);
      local_1a0 = vsubps_avx(auVar18,auVar57);
      local_180 = vsubps_avx(auVar19,auVar33);
      auVar50 = ZEXT3264(local_180);
      uVar23 = (ulong)(bVar24 & ((byte)uVar27 | bVar25));
      local_278 = sphere;
      local_270 = pSVar22;
      do {
        local_230.hit = (RTCHitN *)&local_260;
        local_230.valid = &local_288;
        auVar71 = auVar72._0_28_;
        auVar54 = auVar53._28_36_;
        auVar68 = auVar70._0_28_;
        auVar51 = auVar50._28_36_;
        auVar65 = auVar67._0_28_;
        auVar59 = auVar60._0_28_;
        auVar44 = auVar43._28_36_;
        uVar20 = 0;
        for (uVar13 = uVar23; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
          uVar20 = uVar20 + 1;
        }
        local_248 = *(uint *)(local_80[0] + uVar20 * 4);
        pGVar4 = (pSVar22->geometries).items[local_248].ptr;
        local_230.ray = (RTCRayN *)ray;
        if ((pGVar4->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar21 = true, auVar62 = auVar63._0_32_, auVar57 = auVar58._0_32_,
             auVar33 = auVar64._0_32_, auVar42 = auVar56._0_32_,
             pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01974c6e;
          local_282 = (ushort)uVar27;
          local_160 = auVar63._0_32_;
          local_140 = auVar60._0_32_;
          local_120 = auVar64._0_32_;
          local_100 = auVar58._0_32_;
          local_e0 = auVar56._0_32_;
          local_c0 = auVar72._0_32_;
          local_a0 = auVar70._0_32_;
          local_200 = auVar67._0_32_;
          uVar27 = (ulong)(uint)((int)uVar20 * 4);
          local_24c = *(undefined4 *)((long)&(local_278->primIDs).field_0 + uVar27);
          auVar44 = (undefined1  [36])0x0;
          local_260 = *(undefined4 *)(local_1c0 + uVar27);
          local_25c = *(uint *)(local_1a0 + uVar27);
          auVar53 = ZEXT464(local_25c);
          local_258 = *(undefined4 *)(local_180 + uVar27);
          local_254 = 0;
          local_244 = context->user->instID[0];
          local_240 = context->user->instPrimID[0];
          local_264 = ray->tfar;
          auVar51 = (undefined1  [36])0x0;
          ray->tfar = *(float *)(local_1e0 + uVar27);
          local_288 = -1;
          local_230.geometryUserPtr = pGVar4->userPtr;
          local_230.context = context->user;
          local_230.N = 1;
          local_284 = uVar26;
          if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01974ba5:
            auVar54 = auVar53._28_36_;
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              auVar53 = ZEXT1664(auVar53._0_16_);
              (*p_Var7)(&local_230);
              auVar54 = auVar53._28_36_;
              auVar50._8_56_ = extraout_var_02;
              auVar50._0_8_ = extraout_XMM1_Qa_00;
              auVar51 = extraout_var_02._20_36_;
              auVar44 = extraout_var_00;
              if (*local_230.valid == 0) goto LAB_01974be4;
            }
            bVar21 = true;
            auVar65 = local_200._0_28_;
            auVar68 = local_a0._0_28_;
            auVar71 = local_c0._0_28_;
            auVar59 = local_140._0_28_;
            uVar27 = (ulong)local_282;
            uVar26 = local_284;
            auVar62 = local_160;
            auVar57 = local_100;
            auVar33 = local_120;
            auVar42 = local_e0;
            goto LAB_01974c6e;
          }
          auVar53 = ZEXT464(local_25c);
          local_280 = context;
          (*pGVar4->occlusionFilterN)(&local_230);
          auVar50._8_56_ = extraout_var_01;
          auVar50._0_8_ = extraout_XMM1_Qa;
          auVar51 = extraout_var_01._20_36_;
          context = local_280;
          auVar44 = extraout_var;
          if (*local_230.valid != 0) goto LAB_01974ba5;
LAB_01974be4:
          auVar43 = ZEXT464((uint)local_264);
          ray->tfar = local_264;
          auVar67 = ZEXT3264(local_200);
          auVar70 = ZEXT3264(local_a0);
          auVar72 = ZEXT3264(local_c0);
          auVar56 = ZEXT3264(local_e0);
          auVar58 = ZEXT3264(local_100);
          auVar64 = ZEXT3264(local_120);
          auVar60 = ZEXT3264(local_140);
          auVar63 = ZEXT3264(local_160);
          uVar27 = (ulong)local_282;
          pSVar22 = local_270;
          uVar26 = local_284;
        }
        auVar71 = auVar72._0_28_;
        auVar54 = auVar53._28_36_;
        auVar68 = auVar70._0_28_;
        auVar51 = auVar50._28_36_;
        auVar65 = auVar67._0_28_;
        auVar59 = auVar60._0_28_;
        auVar44 = auVar43._28_36_;
        uVar23 = uVar23 ^ 1L << (uVar20 & 0x3f);
      } while (uVar23 != 0);
      bVar21 = false;
      auVar62 = auVar63._0_32_;
      auVar57 = auVar58._0_32_;
      auVar33 = auVar64._0_32_;
      auVar42 = auVar56._0_32_;
LAB_01974c6e:
      local_280 = context;
      fVar1 = ray->tfar;
      auVar15._4_4_ = fVar1;
      auVar15._0_4_ = fVar1;
      auVar15._8_4_ = fVar1;
      auVar15._12_4_ = fVar1;
      auVar15._16_4_ = fVar1;
      auVar15._20_4_ = fVar1;
      auVar15._24_4_ = fVar1;
      auVar15._28_4_ = fVar1;
      uVar9 = vcmpps_avx512vl(auVar62,auVar15,2);
      bVar24 = (byte)uVar27 & (byte)uVar9;
      if ((bVar24 & (byte)uVar26) == 0) {
        return bVar21;
      }
      fVar1 = auVar59._0_4_;
      auVar58._0_4_ = auVar65._0_4_ * fVar1;
      fVar28 = auVar59._4_4_;
      auVar58._4_4_ = auVar65._4_4_ * fVar28;
      fVar45 = auVar59._8_4_;
      auVar58._8_4_ = auVar65._8_4_ * fVar45;
      fVar46 = auVar59._12_4_;
      auVar58._12_4_ = auVar65._12_4_ * fVar46;
      fVar36 = auVar59._16_4_;
      auVar58._16_4_ = auVar65._16_4_ * fVar36;
      fVar37 = auVar59._20_4_;
      auVar58._20_4_ = auVar65._20_4_ * fVar37;
      fVar38 = auVar59._24_4_;
      auVar58._24_4_ = auVar65._24_4_ * fVar38;
      auVar58._28_36_ = auVar44;
      auVar64._0_4_ = auVar68._0_4_ * fVar1;
      auVar64._4_4_ = auVar68._4_4_ * fVar28;
      auVar64._8_4_ = auVar68._8_4_ * fVar45;
      auVar64._12_4_ = auVar68._12_4_ * fVar46;
      auVar64._16_4_ = auVar68._16_4_ * fVar36;
      auVar64._20_4_ = auVar68._20_4_ * fVar37;
      auVar64._24_4_ = auVar68._24_4_ * fVar38;
      auVar64._28_36_ = auVar51;
      auVar67._0_4_ = auVar71._0_4_ * fVar1;
      auVar67._4_4_ = auVar71._4_4_ * fVar28;
      auVar67._8_4_ = auVar71._8_4_ * fVar45;
      auVar67._12_4_ = auVar71._12_4_ * fVar46;
      auVar67._16_4_ = auVar71._16_4_ * fVar36;
      auVar67._20_4_ = auVar71._20_4_ * fVar37;
      auVar67._24_4_ = auVar71._24_4_ * fVar38;
      auVar67._28_36_ = auVar54;
      local_1c0 = vsubps_avx(auVar58._0_32_,auVar57);
      local_1a0 = vsubps_avx(auVar64._0_32_,auVar33);
      local_1e0 = auVar62;
      local_180 = vsubps_avx(auVar67._0_32_,auVar42);
      local_270 = local_280->scene;
      uVar27 = (ulong)(bVar24 & (byte)uVar26);
      do {
        local_230.hit = (RTCHitN *)&local_260;
        local_230.valid = &local_288;
        uVar23 = 0;
        for (uVar20 = uVar27; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
          uVar23 = uVar23 + 1;
        }
        local_248 = *(uint *)(local_80[0] + uVar23 * 4);
        pGVar4 = (local_270->geometries).items[local_248].ptr;
        if ((pGVar4->mask & ray->mask) != 0) {
          if ((local_280->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar24 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01974e6a;
          uVar20 = (ulong)(uint)((int)uVar23 * 4);
          local_24c = *(undefined4 *)((long)&(local_278->primIDs).field_0 + uVar20);
          local_260 = *(undefined4 *)(local_1c0 + uVar20);
          local_25c = *(uint *)(local_1a0 + uVar20);
          local_258 = *(undefined4 *)(local_180 + uVar20);
          local_254 = 0;
          local_244 = local_280->user->instID[0];
          local_240 = local_280->user->instPrimID[0];
          local_200._0_4_ = ray->tfar;
          ray->tfar = *(float *)(local_1e0 + uVar20);
          local_288 = -1;
          local_230.geometryUserPtr = pGVar4->userPtr;
          local_230.context = local_280->user;
          local_230.N = 1;
          local_230.ray = (RTCRayN *)ray;
          if ((pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar4->occlusionFilterN)(&local_230), *local_230.valid != 0)) {
            p_Var7 = local_280->args->filter;
            if ((p_Var7 == (RTCFilterFunctionN)0x0) ||
               ((((local_280->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar4->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var7)(&local_230), *local_230.valid != 0)))) {
              bVar24 = 1;
              goto LAB_01974e6a;
            }
          }
          ray->tfar = (float)local_200._0_4_;
        }
        uVar27 = uVar27 ^ 1L << (uVar23 & 0x3f);
        if (uVar27 == 0) {
          bVar24 = 0;
LAB_01974e6a:
          return (bool)(bVar21 | bVar24);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        return SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Occluded1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }